

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O0

void __thiscall
QVersionNumber::SegmentStorage::setSegments(SegmentStorage *this,int len,int maj,int min,int mic)

{
  long lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  SegmentStorage *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int data [3];
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_EDX == (char)in_EDX) && (in_ECX == (char)in_ECX)) && (in_R8D == (char)in_R8D)) {
    setInlineData(in_RDI,(int *)&stack0xffffffffffffffec,(long)in_ESI);
  }
  else {
    setVector((SegmentStorage *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
              in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20),
              (int)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setSegments(int len, int maj, int min = 0, int mic = 0)
        {
            if (maj == qint8(maj) && min == qint8(min) && mic == qint8(mic)) {
                int data[] = { maj, min, mic };
                setInlineData(data, len);
            } else {
                setVector(len, maj, min, mic);
            }
        }